

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.h
# Opt level: O3

uint32_t __thiscall asmjit::_abi_1_10::InstNode::getRewriteIndex(InstNode *this,uint32_t *id)

{
  uint *puVar1;
  int *piVar2;
  RABlockFlags *pRVar3;
  Array<unsigned_char,_4UL> *pAVar4;
  uint32_t uVar5;
  uint32_t *puVar6;
  FuncNode *pFVar7;
  BaseNode *pBVar8;
  InstControlFlow IVar9;
  void *pvVar10;
  NodeType NVar11;
  uint uVar12;
  Error EVar13;
  RABlockFlags RVar14;
  RABlock *pRVar15;
  RABlock *pRVar16;
  Logger *pLVar17;
  undefined8 extraout_RAX;
  byte bVar18;
  byte bVar19;
  byte bVar20;
  uint in_ECX;
  ulong uVar21;
  uint extraout_EDX;
  uint uVar22;
  int extraout_EDX_00;
  int extraout_EDX_01;
  InvokeNode *initialNode;
  RACFGBuilder *this_00;
  RATiedReg *pRVar23;
  BaseRAPass *pBVar24;
  byte bVar25;
  int in_R8D;
  uint in_R9D;
  uint uVar26;
  long lVar27;
  RABlock **ppRVar28;
  uint uVar29;
  InvokeNode *invokeNode;
  uint64_t uVar30;
  float __x;
  uint unaff_retaddr;
  int in_stack_00000008;
  uint in_stack_00000010;
  uint in_stack_00000018;
  uint in_stack_00000020;
  InstControlFlow IStack_10fc;
  RABlock **ppRStack_10f8;
  LabelNode *pLStack_10f0;
  ZoneVector<asmjit::_abi_1_10::RABlock_*> ZStack_10e8;
  long lStack_10d8;
  RABlock *pRStack_10d0;
  RAInstBuilder RStack_10c8;
  ulong uStack_80;
  ulong uStack_78;
  ulong uStack_70;
  undefined8 uStack_68;
  ulong uStack_60;
  ulong uStack_58;
  code *pcStack_50;
  undefined8 uStack_48;
  
  this_00 = (RACFGBuilder *)&(this->_baseInst)._extraReg._id;
  if (id < this_00) {
    getRewriteIndex();
  }
  else {
    id = (uint32_t *)((long)id - (long)this_00 >> 2);
    if (id < (uint32_t *)0x20) {
      return (uint32_t)id;
    }
  }
  getRewriteIndex();
  uVar12 = id[8] >> 8 & 0xf;
  lVar27 = *(long *)(id + 4);
  bVar25 = (byte)in_R8D;
  bVar18 = (byte)(id[8] >> 8);
  bVar20 = (byte)uVar12;
  uVar22 = extraout_EDX;
  if (in_R8D != 0xff) {
    ppRVar28 = &(this_00->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>)._curBlock;
    *(uint *)ppRVar28 = *(uint *)ppRVar28 | 0x100 << (bVar18 & 0xf);
    if (3 < bVar20) {
      uStack_48 = 0x13607a;
      RAInstBuilder::add();
      goto LAB_0013607a;
    }
    pAVar4 = &(this_00->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>)._formatOptions.
              _indentation + ((ulong)uVar12 - 0x12);
    *(uint *)pAVar4->_data = *(uint *)pAVar4->_data | 1 << (bVar25 & 0x1f);
    uVar22 = extraout_EDX | 0x40;
  }
  bVar19 = (byte)in_stack_00000008;
  if (in_stack_00000008 != 0xff) {
    if (3 < bVar20) {
LAB_0013607a:
      uStack_48 = 0x13607f;
      RAInstBuilder::add();
      return 0x41;
    }
    pAVar4 = &(this_00->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>)._formatOptions.
              _indentation + ((ulong)uVar12 - 0xe);
    *(uint *)pAVar4->_data = *(uint *)pAVar4->_data | 1 << (bVar19 & 0x1f);
    uVar22 = uVar22 | 0x80;
  }
  puVar1 = (uint *)((long)&(this_00->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>).
                           _pass + 4);
  *puVar1 = *puVar1 | uVar22;
  uVar29 = 1 << (bVar18 & 0xf);
  ppRVar28 = &(this_00->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>)._curBlock;
  *(uint *)ppRVar28 = *(uint *)ppRVar28 | uVar29;
  if (lVar27 != 0) {
    if (*(uint *)(lVar27 + 4) != in_stack_00000020) {
      if (*(uint *)(lVar27 + 4) != 0xffffffff) {
        return 3;
      }
      *(uint *)(lVar27 + 4) = in_stack_00000020;
    }
    if (in_R8D != 0xff) {
      if (*(char *)(lVar27 + 0xe) != -1) {
        return 0x41;
      }
      *(byte *)(lVar27 + 0xe) = bVar25;
    }
    if (in_stack_00000008 != 0xff) {
      if (*(char *)(lVar27 + 0xf) != -1) {
        return 0x41;
      }
      *(byte *)(lVar27 + 0xf) = bVar19;
    }
    *(char *)(lVar27 + 0xc) = *(char *)(lVar27 + 0xc) + '\x01';
    *(uint *)(lVar27 + 8) = *(uint *)(lVar27 + 8) | uVar22;
    *(uint *)(lVar27 + 0x10) = *(uint *)(lVar27 + 0x10) & in_ECX;
    *(uint *)(lVar27 + 0x18) = *(uint *)(lVar27 + 0x18) | in_R9D;
    *(uint *)(lVar27 + 0x14) = *(uint *)(lVar27 + 0x14) & unaff_retaddr;
    *(uint *)(lVar27 + 0x1c) = *(uint *)(lVar27 + 0x1c) | in_stack_00000010;
    bVar20 = (byte)in_stack_00000018;
    if (in_stack_00000018 < *(byte *)(lVar27 + 0xd)) {
      bVar20 = *(byte *)(lVar27 + 0xd);
    }
    *(byte *)(lVar27 + 0xd) = bVar20;
    return 0;
  }
  puVar6 = *(uint32_t **)
            &(this_00->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>).
             _sharedAssignmentsMap.super_ZoneVectorBase._size;
  if (((long)puVar6 + (-0x40 - (long)this_00) & 0x1ffffff000U) == 0) {
    *(uint32_t **)
     &(this_00->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>)._sharedAssignmentsMap.
      super_ZoneVectorBase._size = puVar6 + 8;
    *puVar6 = *id;
    puVar6[1] = in_stack_00000020;
    puVar6[2] = uVar22;
    *(undefined1 *)(puVar6 + 3) = 1;
    *(byte *)((long)puVar6 + 0xd) = (byte)in_stack_00000018;
    *(byte *)((long)puVar6 + 0xe) = bVar25;
    *(byte *)((long)puVar6 + 0xf) = bVar19;
    puVar6[4] = in_ECX;
    puVar6[5] = unaff_retaddr;
    puVar6[6] = in_R9D;
    puVar6[7] = in_stack_00000010;
    *(uint32_t **)(id + 4) = puVar6;
    if (3 < bVar20) goto LAB_0013608b;
    if (*(char *)((long)(&(this_00->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>).
                          _formatOptions._indentation + -0x14) + (ulong)uVar12) != -1) {
      piVar2 = (int *)((long)&(this_00->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>).
                              _cc + 4);
      *piVar2 = *piVar2 + (1 << (bVar20 * '\b' & 0x1f));
      return 0;
    }
  }
  else {
    uStack_48 = 0x13608b;
    RAInstBuilder::add();
LAB_0013608b:
    uStack_48 = 0x136090;
    RAInstBuilder::add();
  }
  uStack_48 = 0x136095;
  RAInstBuilder::add();
  if (extraout_EDX_00 == 0xff) {
    pcStack_50 = (code *)0x13618f;
    RAInstBuilder::addCallArg();
LAB_0013618f:
    pcStack_50 = (code *)0x136194;
    RAInstBuilder::addCallArg();
LAB_00136194:
    pcStack_50 = (code *)0x136199;
    RAInstBuilder::addCallArg();
  }
  else {
    uVar22 = id[8];
    uVar12 = uVar22 >> 8 & 0xf;
    bVar20 = (byte)extraout_EDX_00;
    uVar26 = 1 << (bVar20 & 0x1f);
    puVar1 = (uint *)((long)&(this_00->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>).
                             _pass + 4);
    *puVar1 = *puVar1 | 0x45;
    if (3 < (byte)uVar12) goto LAB_0013618f;
    pAVar4 = &(this_00->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>)._formatOptions.
              _indentation + ((ulong)uVar12 - 0x12);
    *(uint *)pAVar4->_data = *(uint *)pAVar4->_data | uVar26;
    ppRVar28 = &(this_00->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>)._curBlock;
    *(uint *)ppRVar28 = *(uint *)ppRVar28 | 0x101 << ((byte)(uVar22 >> 8) & 0xf);
    lVar27 = *(long *)(id + 4);
    if (lVar27 != 0) {
      if (*(char *)(lVar27 + 0xe) == -1) {
        *(byte *)(lVar27 + 0xe) = bVar20;
        *(uint *)(lVar27 + 0x10) = *(uint *)(lVar27 + 0x10) & uVar26;
        uVar22 = 0x45;
      }
      else {
        *(uint *)(lVar27 + 0x10) = *(uint *)(lVar27 + 0x10) | uVar26;
        uVar22 = 0x10045;
      }
      *(char *)(lVar27 + 0xc) = *(char *)(lVar27 + 0xc) + '\x01';
      *(uint *)(lVar27 + 8) = *(uint *)(lVar27 + 8) | uVar22;
      return 0;
    }
    puVar6 = *(uint32_t **)
              &(this_00->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>).
               _sharedAssignmentsMap.super_ZoneVectorBase._size;
    if (((long)puVar6 + (-0x40 - (long)this_00) & 0x1ffffff000U) != 0) goto LAB_00136194;
    *(uint32_t **)
     &(this_00->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>)._sharedAssignmentsMap.
      super_ZoneVectorBase._size = puVar6 + 8;
    *puVar6 = *id;
    puVar6[1] = 0xffffffff;
    puVar6[2] = 0x45;
    *(undefined2 *)(puVar6 + 3) = 1;
    *(byte *)((long)puVar6 + 0xe) = bVar20;
    *(undefined1 *)((long)puVar6 + 0xf) = 0xff;
    puVar6[4] = uVar26;
    puVar6[5] = uVar26;
    puVar6[6] = 0;
    puVar6[7] = 0;
    *(uint32_t **)(id + 4) = puVar6;
    if (*(char *)((long)(&(this_00->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>).
                          _formatOptions._indentation + -0x14) + (ulong)uVar12) != -1) {
      piVar2 = (int *)((long)&(this_00->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>).
                              _cc + 4);
      *piVar2 = *piVar2 + (1 << ((byte)uVar12 * '\b' & 0x1f));
      return 0;
    }
  }
  pcStack_50 = RAInstBuilder::addCallRet;
  RAInstBuilder::addCallArg();
  if (extraout_EDX_01 == 0xff) {
    uStack_58 = 0x13628c;
    RAInstBuilder::addCallRet();
LAB_0013628c:
    uStack_58 = 0x136291;
    RAInstBuilder::addCallRet();
  }
  else {
    uVar22 = id[8];
    uVar12 = uVar22 >> 8 & 0xf;
    bVar20 = (byte)extraout_EDX_01;
    uVar26 = 1 << (bVar20 & 0x1f);
    puVar1 = (uint *)((long)&(this_00->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>).
                             _pass + 4);
    *puVar1 = *puVar1 | 0x8a;
    if (3 < (byte)uVar12) goto LAB_0013628c;
    pAVar4 = &(this_00->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>)._formatOptions.
              _indentation + ((ulong)uVar12 - 0x12);
    *(uint *)pAVar4->_data = *(uint *)pAVar4->_data | uVar26;
    ppRVar28 = &(this_00->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>)._curBlock;
    *(uint *)ppRVar28 = *(uint *)ppRVar28 | 0x101 << ((byte)(uVar22 >> 8) & 0xf);
    lVar27 = *(long *)(id + 4);
    if (lVar27 != 0) {
      if (*(char *)(lVar27 + 0xf) == -1) {
        *(char *)(lVar27 + 0xc) = *(char *)(lVar27 + 0xc) + '\x01';
        *(byte *)(lVar27 + 8) = *(byte *)(lVar27 + 8) | 0x8a;
        *(byte *)(lVar27 + 0xf) = bVar20;
        return 0;
      }
      return 0x41;
    }
    puVar6 = *(uint32_t **)
              &(this_00->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>).
               _sharedAssignmentsMap.super_ZoneVectorBase._size;
    if (((long)puVar6 + (-0x40 - (long)this_00) & 0x1ffffff000U) == 0) {
      *(uint32_t **)
       &(this_00->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>)._sharedAssignmentsMap.
        super_ZoneVectorBase._size = puVar6 + 8;
      *puVar6 = *id;
      puVar6[1] = 0xffffffff;
      puVar6[2] = 0x8a;
      *(undefined2 *)(puVar6 + 3) = 1;
      *(undefined1 *)((long)puVar6 + 0xe) = 0xff;
      *(byte *)((long)puVar6 + 0xf) = bVar20;
      puVar6[4] = 0xffffffff;
      puVar6[5] = uVar26;
      puVar6[6] = 0;
      puVar6[7] = 0;
      *(uint32_t **)(id + 4) = puVar6;
      if (*(char *)((long)(&(this_00->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>).
                            _formatOptions._indentation + -0x14) + (ulong)uVar12) != -1) {
        piVar2 = (int *)((long)&(this_00->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>)
                                ._cc + 4);
        *piVar2 = *piVar2 + (1 << ((byte)uVar12 * '\b' & 0x1f));
        return 0;
      }
      goto LAB_00136296;
    }
  }
  uStack_58 = 0x136296;
  RAInstBuilder::addCallRet();
LAB_00136296:
  uStack_58 = 0x13629b;
  RAInstBuilder::addCallRet();
  uStack_68 = 0x1ffffff000;
  pLVar17 = (this_00->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>)._logger;
  uStack_80 = (ulong)in_ECX;
  uStack_78 = (ulong)unaff_retaddr;
  uStack_70 = (ulong)in_stack_00000020;
  uStack_60 = (ulong)uVar29;
  uStack_58 = (ulong)in_stack_00000018;
  if (pLVar17 != (Logger *)0x0) {
    Logger::logf(pLVar17,__x);
  }
  EVar13 = RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>::prepare
                     (&this_00->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>);
  if (EVar13 == 0) {
    if (((this_00->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>)._logger !=
         (Logger *)0x0) &&
       (RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>::_logNode
                  (&this_00->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>,
                   (BaseNode *)
                   (this_00->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>)._funcNode,2,
                   (char *)0x0),
       (this_00->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>)._logger != (Logger *)0x0
       )) {
      RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>::_logBlock
                (&this_00->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>,
                 (this_00->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>)._curBlock,2);
    }
    ppRVar28 = &(this_00->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>)._curBlock;
    pFVar7 = (this_00->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>)._funcNode;
    invokeNode = (InvokeNode *)
                 ((anon_union_16_2_06f92970_for_BaseNode_0 *)&pFVar7->super_LabelNode)->_links[1];
    if (invokeNode != (InvokeNode *)0x0) {
      pRStack_10d0 = (this_00->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>)._curBlock;
      pRStack_10d0->_first = (BaseNode *)pFVar7;
      pRStack_10d0->_last = (BaseNode *)pFVar7;
      RStack_10c8._cur = RStack_10c8._tiedRegs;
      RStack_10c8._used._masks._data[3] = 0;
      RStack_10c8._clobbered._masks._data[0] = 0;
      RStack_10c8._clobbered._masks._data[1] = 0;
      RStack_10c8._clobbered._masks._data[2] = 0;
      RStack_10c8._stats._packed = 0;
      RStack_10c8._used._masks._data[0] = 0;
      RStack_10c8._used._masks._data[1] = 0;
      RStack_10c8._used._masks._data[2] = 0;
      RStack_10c8._instRWFlags = kNone;
      RStack_10c8._aggregatedFlags = kNone;
      RStack_10c8._forbiddenFlags = kNone;
      RStack_10c8._count.field_0 = (anon_union_4_2_ebeb14a8_for_RARegCount_0)0x0;
      RStack_10c8._clobbered._masks._data[3] = 0;
      ZStack_10e8.super_ZoneVectorBase._data = (void *)0x0;
      ZStack_10e8.super_ZoneVectorBase._size = 0;
      ZStack_10e8.super_ZoneVectorBase._capacity = 0;
      ppRStack_10f8 = ppRVar28;
LAB_00136376:
      do {
        pRVar23 = RStack_10c8._tiedRegs;
        uVar5 = (invokeNode->super_InstNode).super_BaseNode._position;
        if (1 < uVar5 + 1) {
          DebugUtils::assertionFailed
                    ("/workspace/llm4binary/github/license_c_cmakelists/mitsuba-renderer[P]asmjit/src/asmjit/arm/../arm/../core/rabuilders_p.h"
                     ,0x5e,"node->position() == 0 || node->position() == kNodePositionDidOnBefore");
        }
        initialNode = (InvokeNode *)(invokeNode->super_InstNode).super_BaseNode.field_0._links[1];
        if (((invokeNode->super_InstNode).super_BaseNode.field_1._any._nodeFlags & kActsAsInst) ==
            kNone) {
          NVar11 = (invokeNode->super_InstNode).super_BaseNode.field_1._any._nodeType;
          if (NVar11 == kLabel) {
            pRVar15 = *ppRVar28;
            pRVar16 = (RABlock *)(invokeNode->super_InstNode).super_BaseNode._passData;
            if (pRVar15 == (RABlock *)0x0) {
              *ppRVar28 = pRVar16;
              if (pRVar16 == (RABlock *)0x0) {
                pRVar16 = BaseRAPass::newBlock
                                    ((this_00->
                                     super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>).
                                     _pass,(BaseNode *)invokeNode);
                (this_00->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>)._curBlock =
                     pRVar16;
                if (pRVar16 == (RABlock *)0x0) {
                  return 1;
                }
                (invokeNode->super_InstNode).super_BaseNode._passData = pRVar16;
                RVar14 = pRVar16->_flags;
              }
              else {
                RVar14 = pRVar16->_flags;
                if ((RVar14 & kIsConstructed) != kNone) goto LAB_00136a94;
              }
              pRVar16->_flags = RVar14 | kIsTargetable;
              (this_00->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>)._hasCode = false;
              (this_00->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>)._blockRegStats.
              _packed = 0;
              EVar13 = BaseRAPass::addBlock
                                 ((this_00->
                                  super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>)._pass,
                                  pRVar16);
              if (EVar13 != 0) {
                return EVar13;
              }
              pRVar16 = *ppRStack_10f8;
            }
            else if (pRVar16 == (RABlock *)0x0) {
              if ((pRVar15 == pRStack_10d0 |
                  (this_00->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>)._hasCode) ==
                  1) {
                if ((InvokeNode *)pRVar15->_last == invokeNode) goto LAB_00136b2d;
                pRVar15->_last = (invokeNode->super_InstNode).super_BaseNode.field_0.field_0._prev;
                pRVar15->_flags = pRVar15->_flags | (kHasConsecutive|kIsConstructed);
                (pRVar15->_regsStats)._packed =
                     (pRVar15->_regsStats)._packed |
                     (this_00->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>).
                     _blockRegStats._packed;
                pRVar15 = BaseRAPass::newBlock
                                    ((this_00->
                                     super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>).
                                     _pass,(BaseNode *)invokeNode);
                if (pRVar15 == (RABlock *)0x0) {
                  return 1;
                }
                *(undefined1 *)&pRVar15->_flags = (char)pRVar15->_flags | kIsTargetable;
                EVar13 = RABlock::appendSuccessor(*ppRStack_10f8,pRVar15);
                if (EVar13 != 0) {
                  return EVar13;
                }
                EVar13 = BaseRAPass::addBlock
                                   ((this_00->
                                    super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>)._pass
                                    ,pRVar15);
                if (EVar13 != 0) {
                  return EVar13;
                }
                (this_00->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>)._curBlock =
                     pRVar15;
                (this_00->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>)._hasCode =
                     false;
                (this_00->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>)._blockRegStats.
                _packed = 0;
              }
              (invokeNode->super_InstNode).super_BaseNode._passData = pRVar15;
              pRVar16 = pRVar15;
            }
            else {
              *(undefined1 *)&pRVar16->_flags = (char)pRVar16->_flags | kIsTargetable;
              if (pRVar15 == pRVar16) {
                pRVar16 = pRVar15;
                if ((this_00->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>)._hasCode !=
                    false) break;
              }
              else {
                if ((InvokeNode *)pRVar15->_last == invokeNode) {
LAB_00136b28:
                  RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>::run();
LAB_00136b2d:
                  RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>::run();
                  __clang_call_terminate(extraout_RAX);
                }
                pRVar15->_last = (invokeNode->super_InstNode).super_BaseNode.field_0.field_0._prev;
                pRVar15->_flags = pRVar15->_flags | (kHasConsecutive|kIsConstructed);
                (pRVar15->_regsStats)._packed =
                     (pRVar15->_regsStats)._packed |
                     (this_00->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>).
                     _blockRegStats._packed;
                EVar13 = RABlock::appendSuccessor(pRVar15,pRVar16);
                if (EVar13 != 0) {
                  return EVar13;
                }
                EVar13 = BaseRAPass::addBlock
                                   ((this_00->
                                    super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>)._pass
                                    ,pRVar16);
                if (EVar13 != 0) {
                  return EVar13;
                }
                (this_00->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>)._curBlock =
                     pRVar16;
                (this_00->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>)._hasCode =
                     false;
                (this_00->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>)._blockRegStats.
                _packed = 0;
              }
            }
            ppRVar28 = ppRStack_10f8;
            pLVar17 = (this_00->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>)._logger;
            if ((pRVar16 == (RABlock *)0x0) ||
               (pRVar16 ==
                (this_00->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>).
                _lastLoggedBlock)) {
LAB_00136952:
              if (pLVar17 != (Logger *)0x0) {
                RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>::_logNode
                          (&this_00->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>,
                           (BaseNode *)invokeNode,2,(char *)0x0);
              }
            }
            else if (pLVar17 != (Logger *)0x0) {
              RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>::_logBlock
                        (&this_00->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>,pRVar16
                         ,2);
              pLVar17 = (this_00->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>)._logger
              ;
              goto LAB_00136952;
            }
            if ((invokeNode->super_InstNode)._baseInst._id ==
                (this_00->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>)._exitLabelId) {
              pRVar15 = (this_00->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>).
                        _curBlock;
              pRVar15->_last = (BaseNode *)invokeNode;
              *(undefined1 *)&pRVar15->_flags = (char)pRVar15->_flags | kIsConstructed;
              (pRVar15->_regsStats)._packed =
                   (pRVar15->_regsStats)._packed |
                   (this_00->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>).
                   _blockRegStats._packed;
              EVar13 = BaseRAPass::addExitBlock
                                 ((this_00->
                                  super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>)._pass,
                                  pRVar15);
LAB_0013670d:
              if (EVar13 != 0) {
                return EVar13;
              }
              goto LAB_001369b3;
            }
          }
          else {
            if ((this_00->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>)._logger !=
                (Logger *)0x0) {
              RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>::_logNode
                        (&this_00->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>,
                         (BaseNode *)invokeNode,4,(char *)0x0);
              NVar11 = (invokeNode->super_InstNode).super_BaseNode.field_1._any._nodeType;
            }
            if (NVar11 == kSentinel) {
              if (invokeNode ==
                  (InvokeNode *)
                  ((this_00->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>)._funcNode)->
                  _end) {
                if (((this_00->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>)._curBlock
                     == (RABlock *)0x0) ||
                   (((this_00->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>)._hasCode &
                    1U) == 0)) goto LAB_00136a94;
                break;
              }
            }
            else if ((NVar11 == kFunc) &&
                    (invokeNode !=
                     (InvokeNode *)
                     (this_00->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>)._funcNode)
                    ) break;
          }
        }
        else {
          if (*ppRVar28 == (RABlock *)0x0) {
            RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>::removeNode
                      (&this_00->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>,
                       (BaseNode *)invokeNode);
            invokeNode = initialNode;
            goto LAB_00136376;
          }
          (this_00->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>)._hasCode = true;
          NVar11 = (invokeNode->super_InstNode).super_BaseNode.field_1._any._nodeType;
          if (NVar11 == kFuncRet) {
            if (uVar5 != 0xffffffff) goto LAB_001364df;
LAB_001364fc:
            (invokeNode->super_InstNode).super_BaseNode._position = 0;
          }
          else if (NVar11 == kInvoke) {
            if (uVar5 == 0xffffffff) goto LAB_001364fc;
            pBVar8 = (invokeNode->super_InstNode).super_BaseNode.field_0.field_0._prev;
            EVar13 = a64::RACFGBuilder::onBeforeInvoke(this_00,invokeNode);
            if (EVar13 != 0) {
              return EVar13;
            }
            if (pBVar8 != (invokeNode->super_InstNode).super_BaseNode.field_0.field_0._prev) {
              if ((InvokeNode *)(*ppRVar28)->_first == invokeNode) {
                (*ppRVar28)->_first = (pBVar8->field_0).field_0._next;
              }
              (invokeNode->super_InstNode).super_BaseNode._position = 0xffffffff;
              invokeNode = (InvokeNode *)(pBVar8->field_0)._links[1];
              if (((invokeNode->super_InstNode).super_BaseNode.field_1._any._nodeFlags & kActsAsInst
                  ) == kNone) {
                RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>::run();
                goto LAB_00136b28;
              }
            }
LAB_001364df:
            initialNode = (InvokeNode *)
                          (invokeNode->super_InstNode).super_BaseNode.field_0._links[1];
          }
          if ((this_00->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>)._logger !=
              (Logger *)0x0) {
            RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>::_logNode
                      (&this_00->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>,
                       (BaseNode *)invokeNode,4,(char *)0x0);
          }
          IStack_10fc = kRegular;
          RStack_10c8._instRWFlags = kNone;
          RStack_10c8._aggregatedFlags = kNone;
          RStack_10c8._forbiddenFlags = kNone;
          RStack_10c8._count.field_0 = (anon_union_4_2_ebeb14a8_for_RARegCount_0)0x0;
          RStack_10c8._stats._packed = 0;
          RStack_10c8._used._masks._data[0] = 0;
          RStack_10c8._used._masks._data[1] = 0;
          RStack_10c8._used._masks._data[2] = 0;
          RStack_10c8._used._masks._data[3] = 0;
          RStack_10c8._clobbered._masks._data[0] = 0;
          RStack_10c8._clobbered._masks._data[1] = 0;
          RStack_10c8._clobbered._masks._data[2] = 0;
          RStack_10c8._clobbered._masks._data[3] = 0;
          RStack_10c8._cur = pRVar23;
          EVar13 = a64::RACFGBuilder::onInst
                             (this_00,&invokeNode->super_InstNode,&IStack_10fc,&RStack_10c8);
          if (EVar13 != 0) {
            return EVar13;
          }
          NVar11 = (invokeNode->super_InstNode).super_BaseNode.field_1._any._nodeType;
          if (NVar11 == kInvoke) {
            EVar13 = a64::RACFGBuilder::onInvoke(this_00,invokeNode,&RStack_10c8);
            if (EVar13 != 0) {
              return EVar13;
            }
            NVar11 = (invokeNode->super_InstNode).super_BaseNode.field_1._any._nodeType;
          }
          if (NVar11 == kFuncRet) {
            EVar13 = a64::RACFGBuilder::onRet(this_00,(FuncRetNode *)invokeNode,&RStack_10c8);
            if (EVar13 != 0) {
              return EVar13;
            }
            IStack_10fc = kMaxValue;
          }
          else if ((IStack_10fc == kJump) && (pRVar23 != RStack_10c8._cur)) {
            pBVar24 = (this_00->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>)._pass;
            uVar22 = 0;
            do {
              if ((pBVar24->_workRegs).super_ZoneVectorBase._size <= pRVar23->_workId) {
                RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>::run();
                goto LAB_00136af2;
              }
              if ((*(byte *)(*(long *)((long)(pBVar24->_workRegs).super_ZoneVectorBase._data +
                                      (ulong)pRVar23->_workId * 8) + 0x21) & 0xf) == 0) {
                bVar20 = (pRVar23->field_3).field_0._useId;
                if (bVar20 == 0xff) {
                  if (1 < uVar22) {
                    RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>::run();
                    return 1;
                  }
                  uVar21 = (ulong)uVar22;
                  uVar22 = uVar22 + 1;
                  bVar20 = (pBVar24->_scratchRegIndexes)._data[uVar21];
                  (pRVar23->field_3).field_0._useId = bVar20;
                }
                (*ppRVar28)->_exitScratchGpRegs =
                     (*ppRVar28)->_exitScratchGpRegs | 1 << (bVar20 & 0x1f);
              }
              pRVar23 = pRVar23 + 1;
            } while (pRVar23 != RStack_10c8._cur);
          }
          EVar13 = BaseRAPass::assignRAInst
                             ((this_00->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>).
                              _pass,(BaseNode *)invokeNode,
                              (this_00->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>).
                              _curBlock,&RStack_10c8);
          IVar9 = IStack_10fc;
          if (EVar13 != 0) {
            return EVar13;
          }
          uVar22 = (this_00->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>).
                   _blockRegStats._packed | RStack_10c8._stats._packed;
          (this_00->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>)._blockRegStats.
          _packed = uVar22;
          if (IStack_10fc == kRegular) goto LAB_001369ba;
          if (kBranch < IStack_10fc) {
            if (IStack_10fc != kMaxValue) goto LAB_001369ba;
            pRVar15 = (this_00->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>)._curBlock
            ;
            pRVar15->_last = (BaseNode *)invokeNode;
            *(undefined1 *)&pRVar15->_flags = (char)pRVar15->_flags | kIsConstructed;
            (pRVar15->_regsStats)._packed = (pRVar15->_regsStats)._packed | uVar22;
            EVar13 = RABlock::appendSuccessor
                               (pRVar15,(this_00->
                                        super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>).
                                        _retBlock);
            goto LAB_0013670d;
          }
          pRVar15 = *ppRVar28;
          pRVar15->_last = (BaseNode *)invokeNode;
          RVar14 = pRVar15->_flags;
          pRVar15->_flags = RVar14 | (kHasTerminator|kIsConstructed);
          (pRVar15->_regsStats)._packed = (pRVar15->_regsStats)._packed | uVar22;
          if (((invokeNode->super_InstNode)._baseInst._options & kUnfollow) == kNone) {
            bVar20 = (invokeNode->super_InstNode).super_BaseNode.field_1._any._reserved0;
            if (bVar20 == 0) break;
            uVar22 = bVar20 - 1;
            if (((invokeNode->super_InstNode)._opArray[uVar22]._signature._bits & 7) == 4) {
              EVar13 = BaseBuilder::labelNodeOf
                                 (&((this_00->
                                    super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>)._cc)
                                   ->super_BaseBuilder,&pLStack_10f0,
                                  (invokeNode->super_InstNode)._opArray[uVar22]._baseId);
              if (EVar13 != 0) {
                return EVar13;
              }
              pRVar15 = BaseRAPass::newBlockOrExistingAt
                                  ((this_00->
                                   super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>)._pass,
                                   pLStack_10f0,(BaseNode **)0x0);
              if (pRVar15 == (RABlock *)0x0) {
                return 1;
              }
              *(undefined1 *)&pRVar15->_flags = (char)pRVar15->_flags | kIsTargetable;
              EVar13 = RABlock::appendSuccessor(*ppRVar28,pRVar15);
            }
            else {
              pRVar15->_flags = RVar14 | (kHasJumpTable|kHasTerminator|kIsConstructed);
              if (((invokeNode->super_InstNode).super_BaseNode.field_1._any._nodeType == kJump) &&
                 (lVar27 = *(long *)&(invokeNode->_funcDetail)._callConv, lVar27 != 0)) {
                pBVar24 = (this_00->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>)._pass
                ;
                uVar30 = pBVar24->_lastTimestamp + 1;
                pBVar24->_lastTimestamp = uVar30;
                uVar22 = *(uint *)(lVar27 + 0x18);
                if ((ulong)uVar22 != 0) {
                  lStack_10d8 = *(long *)(lVar27 + 0x10);
                  lVar27 = 0;
                  do {
                    EVar13 = BaseBuilder::labelNodeOf
                                       (&((this_00->
                                          super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>)
                                         ._cc)->super_BaseBuilder,&pLStack_10f0,
                                        *(uint32_t *)(lStack_10d8 + lVar27));
                    if (EVar13 != 0) {
                      return EVar13;
                    }
                    pRVar15 = BaseRAPass::newBlockOrExistingAt
                                        ((this_00->
                                         super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>).
                                         _pass,pLStack_10f0,(BaseNode **)0x0);
                    if (pRVar15 == (RABlock *)0x0) {
                      return 1;
                    }
                    if (pRVar15->_timestamp != uVar30) {
                      pRVar15->_timestamp = uVar30;
                      *(undefined1 *)&pRVar15->_flags = (char)pRVar15->_flags | kIsTargetable;
                      EVar13 = RABlock::appendSuccessor(*ppRStack_10f8,pRVar15);
                      if (EVar13 != 0) {
                        return EVar13;
                      }
                    }
                    lVar27 = lVar27 + 4;
                  } while ((ulong)uVar22 << 2 != lVar27);
                  pRVar15 = *ppRStack_10f8;
                  ppRVar28 = ppRStack_10f8;
                }
                EVar13 = RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>::
                         shareAssignmentAcrossSuccessors
                                   (&this_00->
                                     super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>,
                                    pRVar15);
              }
              else {
                EVar13 = ZoneVector<asmjit::_abi_1_10::RABlock_*>::append
                                   (&ZStack_10e8,
                                    &((this_00->
                                      super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>).
                                     _pass)->_allocator,ppRVar28);
              }
            }
            if (EVar13 != 0) {
              return EVar13;
            }
          }
          if (IVar9 != kJump) {
            if (initialNode == (InvokeNode *)0x0) break;
            if ((((anon_union_4_5_b2977b59_for_BaseNode_2 *)
                 ((anon_union_16_2_06f92970_for_BaseNode_0 *)&initialNode->super_InstNode + 1))->
                _any)._nodeType == kLabel) {
              pRVar15 = *(RABlock **)
                         &((anon_union_16_2_06f92970_for_BaseNode_0 *)&initialNode->super_InstNode)
                          [2].field_0;
              if (pRVar15 == (RABlock *)0x0) {
                pRVar15 = BaseRAPass::newBlock
                                    ((this_00->
                                     super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>).
                                     _pass,(BaseNode *)initialNode);
                if (pRVar15 == (RABlock *)0x0) {
                  return 1;
                }
                *(RABlock **)
                 &((anon_union_16_2_06f92970_for_BaseNode_0 *)&initialNode->super_InstNode)[2].
                  field_0 = pRVar15;
              }
            }
            else {
              pRVar15 = BaseRAPass::newBlock
                                  ((this_00->
                                   super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>)._pass,
                                   (BaseNode *)initialNode);
              if (pRVar15 == (RABlock *)0x0) {
                return 1;
              }
            }
            pRVar16 = *ppRVar28;
            pRVar3 = &pRVar16->_flags;
            *pRVar3 = *pRVar3 | kHasConsecutive;
            EVar13 = RABlock::prependSuccessor(pRVar16,pRVar15);
            if (EVar13 != 0) {
              return EVar13;
            }
            (this_00->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>)._curBlock = pRVar15
            ;
            (this_00->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>)._hasCode = false;
            (this_00->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>)._blockRegStats.
            _packed = 0;
            if ((pRVar15->_flags & kIsConstructed) != kNone) {
LAB_00136a94:
              pvVar10 = ZStack_10e8.super_ZoneVectorBase._data;
              pBVar24 = (this_00->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>)._pass;
              if (pBVar24->_createdBlockCount == (pBVar24->_blocks).super_ZoneVectorBase._size) {
                uVar21 = ZStack_10e8.super_ZoneVectorBase._8_8_ & 0xffffffff;
                if (uVar21 != 0) {
                  lVar27 = 0;
                  do {
                    RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>::handleBlockWithUnknownJump
                              (&this_00->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>,
                               *(RABlock **)((long)pvVar10 + lVar27));
                    lVar27 = lVar27 + 8;
                  } while (uVar21 << 3 != lVar27);
                  pBVar24 = (this_00->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>).
                            _pass;
                }
                EVar13 = BaseRAPass::initSharedAssignments
                                   (pBVar24,&(this_00->
                                             super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>
                                             )._sharedAssignmentsMap);
                return EVar13;
              }
              return 3;
            }
            EVar13 = BaseRAPass::addBlock
                               ((this_00->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>)
                                ._pass,pRVar15);
            if (EVar13 != 0) {
              return EVar13;
            }
            invokeNode = initialNode;
            if ((this_00->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>)._logger !=
                (Logger *)0x0) {
              RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>::_logBlock
                        (&this_00->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>,
                         (this_00->super_RACFGBuilderT<asmjit::_abi_1_10::a64::RACFGBuilder>).
                         _curBlock,2);
            }
            goto LAB_00136376;
          }
LAB_001369b3:
          *ppRVar28 = (RABlock *)0x0;
        }
LAB_001369ba:
        invokeNode = initialNode;
      } while (initialNode != (InvokeNode *)0x0);
    }
LAB_00136af2:
    EVar13 = 3;
  }
  return EVar13;
}

Assistant:

inline uint32_t getRewriteIndex(const uint32_t* id) const noexcept {
    const uint32_t* array = _getRewriteArray();
    ASMJIT_ASSERT(array <= id);

    size_t index = (size_t)(id - array);
    ASMJIT_ASSERT(index < 32);

    return uint32_t(index);
  }